

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gds2writer.cpp
# Opt level: O1

void __thiscall GDS2Writer::~GDS2Writer(GDS2Writer *this)

{
  ~GDS2Writer(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

GDS2Writer::~GDS2Writer()
{
    writeEpilog();
    fclose(m_fout);
    doLog(LOG_VERBOSE,"GDS2Writer destroyed\n");
}